

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# border_agent.cpp
# Opt level: O3

uint32_t __thiscall ot::commissioner::BorderAgent::State::operator_cast_to_unsigned_int(State *this)

{
  ushort uVar1;
  
  uVar1 = *(ushort *)this;
  return uVar1 >> 8 & 1 |
         uVar1 >> 6 & 2 | uVar1 >> 3 & 0xc | (uVar1 & 7) * 0x40 + (uVar1 & 0x18) * 2;
}

Assistant:

BorderAgent::State::operator uint32_t() const
{
    return ((mConnectionMode << kConnectionModeOffset) & kConnectionModeMask) |
           ((mThreadIfStatus << kThreadIfStatusOffset) & kThreadIfStatusMask) |
           ((mAvailability << kAvailabilityOffset) & kAvailabilityMask) |
           ((mBbrIsActive << kBbrIsActiveOffset) & kBbrIsActiveMask) | (mBbrIsPrimary & kBbrIsPrimaryMask);
}